

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
* __thiscall
cfd::core::ConfidentialTransaction::GetTxOutList
          (vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
           *__return_storage_ptr__,ConfidentialTransaction *this)

{
  bool bVar1;
  reference pCVar2;
  ConfidentialTxOutReference *this_00;
  ConfidentialTxOutReference local_238;
  undefined1 local_130 [8];
  ConfidentialTxOut tx_out;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *__range2;
  ConfidentialTransaction *this_local;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  *refs;
  
  this_00 = (ConfidentialTxOutReference *)__return_storage_ptr__;
  ::std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::vector(__return_storage_ptr__);
  __end2 = ::std::
           vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
           begin(&this->vout_);
  tx_out.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)::std::
                vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ::end(&this->vout_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
                                     *)&tx_out.range_proof_.data_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)
  {
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
             ::operator*(&__end2);
    ConfidentialTxOut::ConfidentialTxOut((ConfidentialTxOut *)local_130,pCVar2);
    ConfidentialTxOutReference::ConfidentialTxOutReference
              (&local_238,(ConfidentialTxOut *)local_130);
    ::std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::push_back((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                 *)this_00,&local_238);
    ConfidentialTxOutReference::~ConfidentialTxOutReference(this_00);
    ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_130);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<ConfidentialTxOutReference>  // force LF
ConfidentialTransaction::GetTxOutList() const {
  std::vector<ConfidentialTxOutReference> refs;
  for (ConfidentialTxOut tx_out : vout_) {
    refs.push_back(ConfidentialTxOutReference(tx_out));
  }
  return refs;
}